

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O2

bool __thiscall
glslang::TOutputTraverser::visitAggregate
          (TOutputTraverser *this,TVisit param_1,TIntermAggregate *node)

{
  TOperator TVar1;
  TInfoSink *infoSink;
  int iVar2;
  undefined4 extraout_var;
  TInfoSinkBase *this_00;
  char *pcVar3;
  TString local_40;
  
  infoSink = this->infoSink;
  if ((node->super_TIntermOperator).op == EOpNull) {
    TInfoSinkBase::message(&infoSink->debug,EPrefixError,"node is still EOpNull!");
    return true;
  }
  OutputTreeText(infoSink,(TIntermNode *)node,(this->super_TIntermTraverser).depth);
  this_00 = &infoSink->debug;
  switch((node->super_TIntermOperator).op) {
  case EOpSequence:
    pcVar3 = "Sequence\n";
    goto LAB_002fb1ab;
  case EOpScope:
    pcVar3 = "Scope\n";
    goto LAB_002fb1ab;
  case EOpLinkerObjects:
    pcVar3 = "Linker Objects\n";
    goto LAB_002fb1ab;
  case EOpFunctionCall:
    pcVar3 = "Function Call: ";
    goto LAB_002f9f73;
  case EOpFunction:
    pcVar3 = "Function Definition: ";
LAB_002f9f73:
    TInfoSinkBase::append(this_00,pcVar3);
    iVar2 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x35])(node);
    TInfoSinkBase::append(this_00,(TString *)CONCAT44(extraout_var,iVar2));
    goto LAB_002fb157;
  case EOpParameters:
    pcVar3 = "Function Parameters: ";
    break;
  case EOpSpirvInst:
    pcVar3 = "spirv_instruction";
    break;
  default:
    TInfoSinkBase::message(this_00,EPrefixError,"Bad aggregation op");
    goto LAB_002fb157;
  case EOpMul:
    pcVar3 = "component-wise multiply";
    break;
  case EOpMod:
    pcVar3 = "mod";
    break;
  case EOpVectorEqual:
    pcVar3 = "Equal";
    break;
  case EOpVectorNotEqual:
    pcVar3 = "NotEqual";
    break;
  case EOpLessThan:
    pcVar3 = "Compare Less Than";
    break;
  case EOpGreaterThan:
    pcVar3 = "Compare Greater Than";
    break;
  case EOpLessThanEqual:
    pcVar3 = "Compare Less Than or Equal";
    break;
  case EOpGreaterThanEqual:
    pcVar3 = "Compare Greater Than or Equal";
    break;
  case EOpComma:
    pcVar3 = "Comma";
    break;
  case EOpAtan:
    pcVar3 = "arc tangent";
    break;
  case EOpPow:
    pcVar3 = "pow";
    break;
  case EOpModf:
    pcVar3 = "modf";
    break;
  case EOpMin:
    pcVar3 = "min";
    break;
  case EOpMax:
    pcVar3 = "max";
    break;
  case EOpClamp:
    pcVar3 = "clamp";
    break;
  case EOpMix:
    pcVar3 = "mix";
    break;
  case EOpStep:
    pcVar3 = "step";
    break;
  case EOpSmoothStep:
    pcVar3 = "smoothstep";
    break;
  case EOpFma:
    pcVar3 = "fma";
    break;
  case EOpFrexp:
    pcVar3 = "frexp";
    break;
  case EOpLdexp:
    pcVar3 = "ldexp";
    break;
  case EOpDistance:
    pcVar3 = "distance";
    break;
  case EOpDot:
    pcVar3 = "dot-product";
    break;
  case EOpCross:
    pcVar3 = "cross-product";
    break;
  case EOpFaceForward:
    pcVar3 = "face-forward";
    break;
  case EOpReflect:
    pcVar3 = "reflect";
    break;
  case EOpRefract:
    pcVar3 = "refract";
    break;
  case EOpMin3:
    pcVar3 = "min3";
    break;
  case EOpMax3:
    pcVar3 = "max3";
    break;
  case EOpMid3:
    pcVar3 = "mid3";
    break;
  case EOpInterpolateAtSample:
    pcVar3 = "interpolateAtSample";
    break;
  case EOpInterpolateAtOffset:
    pcVar3 = "interpolateAtOffset";
    break;
  case EOpInterpolateAtVertex:
    pcVar3 = "interpolateAtVertex";
    break;
  case EOpOuterProduct:
    pcVar3 = "outer product";
    break;
  case EOpEmitVertex:
    pcVar3 = "EmitVertex";
    break;
  case EOpEndPrimitive:
    pcVar3 = "EndPrimitive";
    break;
  case EOpBarrier:
    pcVar3 = "Barrier";
    break;
  case EOpMemoryBarrier:
    pcVar3 = "MemoryBarrier";
    break;
  case EOpMemoryBarrierAtomicCounter:
    pcVar3 = "MemoryBarrierAtomicCounter";
    break;
  case EOpMemoryBarrierBuffer:
    pcVar3 = "MemoryBarrierBuffer";
    break;
  case EOpMemoryBarrierImage:
    pcVar3 = "MemoryBarrierImage";
    break;
  case EOpMemoryBarrierShared:
    pcVar3 = "MemoryBarrierShared";
    break;
  case EOpGroupMemoryBarrier:
    pcVar3 = "GroupMemoryBarrier";
    break;
  case EOpReadInvocation:
    pcVar3 = "readInvocation";
    break;
  case EOpSubgroupBarrier:
    pcVar3 = "subgroupBarrier";
    break;
  case EOpSubgroupMemoryBarrier:
    pcVar3 = "subgroupMemoryBarrier";
    break;
  case EOpSubgroupMemoryBarrierBuffer:
    pcVar3 = "subgroupMemoryBarrierBuffer";
    break;
  case EOpSubgroupMemoryBarrierImage:
    pcVar3 = "subgroupMemoryBarrierImage";
    break;
  case EOpSubgroupMemoryBarrierShared:
    pcVar3 = "subgroupMemoryBarrierShared";
    break;
  case EOpSubgroupElect:
    pcVar3 = "subgroupElect";
    break;
  case EOpSubgroupAll:
    pcVar3 = "subgroupAll";
    break;
  case EOpSubgroupAny:
    pcVar3 = "subgroupAny";
    break;
  case EOpSubgroupAllEqual:
    pcVar3 = "subgroupAllEqual";
    break;
  case EOpSubgroupBroadcast:
    pcVar3 = "subgroupBroadcast";
    break;
  case EOpSubgroupBroadcastFirst:
    pcVar3 = "subgroupBroadcastFirst";
    break;
  case EOpSubgroupBallot:
    pcVar3 = "subgroupBallot";
    break;
  case EOpSubgroupInverseBallot:
    pcVar3 = "subgroupInverseBallot";
    break;
  case EOpSubgroupBallotBitExtract:
    pcVar3 = "subgroupBallotBitExtract";
    break;
  case EOpSubgroupBallotBitCount:
    pcVar3 = "subgroupBallotBitCount";
    break;
  case EOpSubgroupBallotInclusiveBitCount:
    pcVar3 = "subgroupBallotInclusiveBitCount";
    break;
  case EOpSubgroupBallotExclusiveBitCount:
    pcVar3 = "subgroupBallotExclusiveBitCount";
    break;
  case EOpSubgroupBallotFindLSB:
    pcVar3 = "subgroupBallotFindLSB";
    break;
  case EOpSubgroupBallotFindMSB:
    pcVar3 = "subgroupBallotFindMSB";
    break;
  case EOpSubgroupShuffle:
    pcVar3 = "subgroupShuffle";
    break;
  case EOpSubgroupShuffleXor:
    pcVar3 = "subgroupShuffleXor";
    break;
  case EOpSubgroupShuffleUp:
    pcVar3 = "subgroupShuffleUp";
    break;
  case EOpSubgroupShuffleDown:
    pcVar3 = "subgroupShuffleDown";
    break;
  case EOpSubgroupRotate:
    pcVar3 = "subgroupRotate";
    break;
  case EOpSubgroupClusteredRotate:
    pcVar3 = "subgroupClusteredRotate";
    break;
  case EOpSubgroupAdd:
    pcVar3 = "subgroupAdd";
    break;
  case EOpSubgroupMul:
    pcVar3 = "subgroupMul";
    break;
  case EOpSubgroupMin:
    pcVar3 = "subgroupMin";
    break;
  case EOpSubgroupMax:
    pcVar3 = "subgroupMax";
    break;
  case EOpSubgroupAnd:
    pcVar3 = "subgroupAnd";
    break;
  case EOpSubgroupOr:
    pcVar3 = "subgroupOr";
    break;
  case EOpSubgroupXor:
    pcVar3 = "subgroupXor";
    break;
  case EOpSubgroupInclusiveAdd:
    pcVar3 = "subgroupInclusiveAdd";
    break;
  case EOpSubgroupInclusiveMul:
    pcVar3 = "subgroupInclusiveMul";
    break;
  case EOpSubgroupInclusiveMin:
    pcVar3 = "subgroupInclusiveMin";
    break;
  case EOpSubgroupInclusiveMax:
    pcVar3 = "subgroupInclusiveMax";
    break;
  case EOpSubgroupInclusiveAnd:
    pcVar3 = "subgroupInclusiveAnd";
    break;
  case EOpSubgroupInclusiveOr:
    pcVar3 = "subgroupInclusiveOr";
    break;
  case EOpSubgroupInclusiveXor:
    pcVar3 = "subgroupInclusiveXor";
    break;
  case EOpSubgroupExclusiveAdd:
    pcVar3 = "subgroupExclusiveAdd";
    break;
  case EOpSubgroupExclusiveMul:
    pcVar3 = "subgroupExclusiveMul";
    break;
  case EOpSubgroupExclusiveMin:
    pcVar3 = "subgroupExclusiveMin";
    break;
  case EOpSubgroupExclusiveMax:
    pcVar3 = "subgroupExclusiveMax";
    break;
  case EOpSubgroupExclusiveAnd:
    pcVar3 = "subgroupExclusiveAnd";
    break;
  case EOpSubgroupExclusiveOr:
    pcVar3 = "subgroupExclusiveOr";
    break;
  case EOpSubgroupExclusiveXor:
    pcVar3 = "subgroupExclusiveXor";
    break;
  case EOpSubgroupClusteredAdd:
    pcVar3 = "subgroupClusteredAdd";
    break;
  case EOpSubgroupClusteredMul:
    pcVar3 = "subgroupClusteredMul";
    break;
  case EOpSubgroupClusteredMin:
    pcVar3 = "subgroupClusteredMin";
    break;
  case EOpSubgroupClusteredMax:
    pcVar3 = "subgroupClusteredMax";
    break;
  case EOpSubgroupClusteredAnd:
    pcVar3 = "subgroupClusteredAnd";
    break;
  case EOpSubgroupClusteredOr:
    pcVar3 = "subgroupClusteredOr";
    break;
  case EOpSubgroupClusteredXor:
    pcVar3 = "subgroupClusteredXor";
    break;
  case EOpSubgroupQuadBroadcast:
    pcVar3 = "subgroupQuadBroadcast";
    break;
  case EOpSubgroupQuadSwapHorizontal:
    pcVar3 = "subgroupQuadSwapHorizontal";
    break;
  case EOpSubgroupQuadSwapVertical:
    pcVar3 = "subgroupQuadSwapVertical";
    break;
  case EOpSubgroupQuadSwapDiagonal:
    pcVar3 = "subgroupQuadSwapDiagonal";
    break;
  case EOpSubgroupQuadAll:
    pcVar3 = "subgroupQuadAll";
    break;
  case EOpSubgroupQuadAny:
    pcVar3 = "subgroupQuadAny";
    break;
  case EOpSubgroupPartition:
    pcVar3 = "subgroupPartitionNV";
    break;
  case EOpSubgroupPartitionedAdd:
    pcVar3 = "subgroupPartitionedAddNV";
    break;
  case EOpSubgroupPartitionedMul:
    pcVar3 = "subgroupPartitionedMulNV";
    break;
  case EOpSubgroupPartitionedMin:
    pcVar3 = "subgroupPartitionedMinNV";
    break;
  case EOpSubgroupPartitionedMax:
    pcVar3 = "subgroupPartitionedMaxNV";
    break;
  case EOpSubgroupPartitionedAnd:
    pcVar3 = "subgroupPartitionedAndNV";
    break;
  case EOpSubgroupPartitionedOr:
    pcVar3 = "subgroupPartitionedOrNV";
    break;
  case EOpSubgroupPartitionedXor:
    pcVar3 = "subgroupPartitionedXorNV";
    break;
  case EOpSubgroupPartitionedInclusiveAdd:
    pcVar3 = "subgroupPartitionedInclusiveAddNV";
    break;
  case EOpSubgroupPartitionedInclusiveMul:
    pcVar3 = "subgroupPartitionedInclusiveMulNV";
    break;
  case EOpSubgroupPartitionedInclusiveMin:
    pcVar3 = "subgroupPartitionedInclusiveMinNV";
    break;
  case EOpSubgroupPartitionedInclusiveMax:
    pcVar3 = "subgroupPartitionedInclusiveMaxNV";
    break;
  case EOpSubgroupPartitionedInclusiveAnd:
    pcVar3 = "subgroupPartitionedInclusiveAndNV";
    break;
  case EOpSubgroupPartitionedInclusiveOr:
    pcVar3 = "subgroupPartitionedInclusiveOrNV";
    break;
  case EOpSubgroupPartitionedInclusiveXor:
    pcVar3 = "subgroupPartitionedInclusiveXorNV";
    break;
  case EOpSubgroupPartitionedExclusiveAdd:
    pcVar3 = "subgroupPartitionedExclusiveAddNV";
    break;
  case EOpSubgroupPartitionedExclusiveMul:
    pcVar3 = "subgroupPartitionedExclusiveMulNV";
    break;
  case EOpSubgroupPartitionedExclusiveMin:
    pcVar3 = "subgroupPartitionedExclusiveMinNV";
    break;
  case EOpSubgroupPartitionedExclusiveMax:
    pcVar3 = "subgroupPartitionedExclusiveMaxNV";
    break;
  case EOpSubgroupPartitionedExclusiveAnd:
    pcVar3 = "subgroupPartitionedExclusiveAndNV";
    break;
  case EOpSubgroupPartitionedExclusiveOr:
    pcVar3 = "subgroupPartitionedExclusiveOrNV";
    break;
  case EOpSubgroupPartitionedExclusiveXor:
    pcVar3 = "subgroupPartitionedExclusiveXorNV";
    break;
  case EOpDotPackedEXT:
    pcVar3 = "dot-product-packed";
    break;
  case EOpDotAccSatEXT:
    pcVar3 = "dot-product-accumulate-saturate";
    break;
  case EOpDotPackedAccSatEXT:
    pcVar3 = "dot-product-packed-accumulate-saturate";
    break;
  case EOpSwizzleInvocations:
    pcVar3 = "swizzleInvocations";
    break;
  case EOpSwizzleInvocationsMasked:
    pcVar3 = "swizzleInvocationsMasked";
    break;
  case EOpWriteInvocation:
    pcVar3 = "writeInvocation";
    break;
  case EOpTime:
    pcVar3 = "time";
    break;
  case EOpAtomicAdd:
    pcVar3 = "AtomicAdd";
    break;
  case EOpAtomicSubtract:
    pcVar3 = "AtomicSubtract";
    break;
  case EOpAtomicMin:
    pcVar3 = "AtomicMin";
    break;
  case EOpAtomicMax:
    pcVar3 = "AtomicMax";
    break;
  case EOpAtomicAnd:
    pcVar3 = "AtomicAnd";
    break;
  case EOpAtomicOr:
    pcVar3 = "AtomicOr";
    break;
  case EOpAtomicXor:
    pcVar3 = "AtomicXor";
    break;
  case EOpAtomicExchange:
    pcVar3 = "AtomicExchange";
    break;
  case EOpAtomicCompSwap:
    pcVar3 = "AtomicCompSwap";
    break;
  case EOpAtomicLoad:
    pcVar3 = "AtomicLoad";
    break;
  case EOpAtomicStore:
    pcVar3 = "AtomicStore";
    break;
  case EOpAtomicCounterAdd:
    pcVar3 = "AtomicCounterAdd";
    break;
  case EOpAtomicCounterSubtract:
    pcVar3 = "AtomicCounterSubtract";
    break;
  case EOpAtomicCounterMin:
    pcVar3 = "AtomicCounterMin";
    break;
  case EOpAtomicCounterMax:
    pcVar3 = "AtomicCounterMax";
    break;
  case EOpAtomicCounterAnd:
    pcVar3 = "AtomicCounterAnd";
    break;
  case EOpAtomicCounterOr:
    pcVar3 = "AtomicCounterOr";
    break;
  case EOpAtomicCounterXor:
    pcVar3 = "AtomicCounterXor";
    break;
  case EOpAtomicCounterExchange:
    pcVar3 = "AtomicCounterExchange";
    break;
  case EOpAtomicCounterCompSwap:
    pcVar3 = "AtomicCounterCompSwap";
    break;
  case EOpCooperativeMatrixLoad:
    pcVar3 = "Load cooperative matrix KHR";
    break;
  case EOpCooperativeMatrixStore:
    pcVar3 = "Store cooperative matrix KHR";
    break;
  case EOpCooperativeMatrixMulAdd:
    pcVar3 = "MulAdd cooperative matrices KHR";
    break;
  case EOpCooperativeMatrixLoadNV:
    pcVar3 = "Load cooperative matrix NV";
    break;
  case EOpCooperativeMatrixStoreNV:
    pcVar3 = "Store cooperative matrix NV";
    break;
  case EOpCooperativeMatrixLoadTensorNV:
    pcVar3 = "Load cooperative matrix tensor NV";
    break;
  case EOpCooperativeMatrixStoreTensorNV:
    pcVar3 = "Store cooperative matrix tensor NV";
    break;
  case EOpCooperativeMatrixMulAddNV:
    pcVar3 = "MulAdd cooperative matrices NV";
    break;
  case EOpCooperativeMatrixReduceNV:
    pcVar3 = "Reduce cooperative matrices";
    break;
  case EOpCooperativeMatrixPerElementOpNV:
    pcVar3 = "cooperative matrix per element op";
    break;
  case EOpCooperativeMatrixTransposeNV:
    pcVar3 = "Transpose cooperative matrix";
    break;
  case EOpCreateTensorLayoutNV:
    pcVar3 = "createTensorLayout";
    break;
  case EOpTensorLayoutSetBlockSizeNV:
    pcVar3 = "setBlockSize";
    break;
  case EOpTensorLayoutSetDimensionNV:
    pcVar3 = "setDimension";
    break;
  case EOpTensorLayoutSetStrideNV:
    pcVar3 = "setStride";
    break;
  case EOpTensorLayoutSliceNV:
    pcVar3 = "slice";
    break;
  case EOpTensorLayoutSetClampValueNV:
    pcVar3 = "setClampValue";
    break;
  case EOpCreateTensorViewNV:
    pcVar3 = "createTensorView";
    break;
  case EOpTensorViewSetDimensionNV:
    pcVar3 = "setTensorViewDimensions";
    break;
  case EOpTensorViewSetStrideNV:
    pcVar3 = "setTensorViewStride";
    break;
  case EOpTensorViewSetClipNV:
    pcVar3 = "clipTensorView";
    break;
  case EOpCooperativeVectorMatMulNV:
    pcVar3 = "Cooperative vector matrix multiply NV";
    break;
  case EOpCooperativeVectorMatMulAddNV:
    pcVar3 = "Cooperative vector matrix multiply add NV";
    break;
  case EOpCooperativeVectorLoadNV:
    pcVar3 = "Load cooperative vector NV";
    break;
  case EOpCooperativeVectorStoreNV:
    pcVar3 = "Store cooperative vector NV";
    break;
  case EOpCooperativeVectorOuterProductAccumulateNV:
    pcVar3 = "Cooperative vector outer product accumulate NV";
    break;
  case EOpCooperativeVectorReduceSumAccumulateNV:
    pcVar3 = "Cooperative vector reduce sum accumulate NV";
    break;
  case EOpIsHelperInvocation:
    pcVar3 = "IsHelperInvocation";
    break;
  case EOpDebugPrintf:
    pcVar3 = "Debug printf";
    break;
  case EOpTerminateRayKHR:
    pcVar3 = "terminateRayKHR";
    break;
  case EOpIgnoreIntersectionKHR:
    pcVar3 = "ignoreIntersectionKHR";
    break;
  case EOpConstructInt:
    pcVar3 = "Construct int";
    break;
  case EOpConstructUint:
    pcVar3 = "Construct uint";
    break;
  case EOpConstructInt8:
    pcVar3 = "Construct int8_t";
    break;
  case EOpConstructUint8:
    pcVar3 = "Construct uint8_t";
    break;
  case EOpConstructInt16:
    pcVar3 = "Construct int16_t";
    break;
  case EOpConstructUint16:
    pcVar3 = "Construct uint16_t";
    break;
  case EOpConstructInt64:
    pcVar3 = "Construct int64";
    break;
  case EOpConstructUint64:
    pcVar3 = "Construct uint64";
    break;
  case EOpConstructBool:
    pcVar3 = "Construct bool";
    break;
  case EOpConstructFloat:
    pcVar3 = "Construct float";
    break;
  case EOpConstructDouble:
    pcVar3 = "Construct double";
    break;
  case EOpConstructVec2:
    pcVar3 = "Construct vec2";
    break;
  case EOpConstructVec3:
    pcVar3 = "Construct vec3";
    break;
  case EOpConstructVec4:
    pcVar3 = "Construct vec4";
    break;
  case EOpConstructMat2x2:
    pcVar3 = "Construct mat2";
    break;
  case EOpConstructMat2x3:
    pcVar3 = "Construct mat2x3";
    break;
  case EOpConstructMat2x4:
    pcVar3 = "Construct mat2x4";
    break;
  case EOpConstructMat3x2:
    pcVar3 = "Construct mat3x2";
    break;
  case EOpConstructMat3x3:
    pcVar3 = "Construct mat3";
    break;
  case EOpConstructMat3x4:
    pcVar3 = "Construct mat3x4";
    break;
  case EOpConstructMat4x2:
    pcVar3 = "Construct mat4x2";
    break;
  case EOpConstructMat4x3:
    pcVar3 = "Construct mat4x3";
    break;
  case EOpConstructMat4x4:
    pcVar3 = "Construct mat4";
    break;
  case EOpConstructDVec2:
    pcVar3 = "Construct dvec2";
    break;
  case EOpConstructDVec3:
    pcVar3 = "Construct dvec3";
    break;
  case EOpConstructDVec4:
    pcVar3 = "Construct dvec4";
    break;
  case EOpConstructBVec2:
    pcVar3 = "Construct bvec2";
    break;
  case EOpConstructBVec3:
    pcVar3 = "Construct bvec3";
    break;
  case EOpConstructBVec4:
    pcVar3 = "Construct bvec4";
    break;
  case EOpConstructI8Vec2:
    pcVar3 = "Construct i8vec2";
    break;
  case EOpConstructI8Vec3:
    pcVar3 = "Construct i8vec3";
    break;
  case EOpConstructI8Vec4:
    pcVar3 = "Construct i8vec4";
    break;
  case EOpConstructU8Vec2:
    pcVar3 = "Construct u8vec2";
    break;
  case EOpConstructU8Vec3:
    pcVar3 = "Construct u8vec3";
    break;
  case EOpConstructU8Vec4:
    pcVar3 = "Construct u8vec4";
    break;
  case EOpConstructI16Vec2:
    pcVar3 = "Construct i16vec2";
    break;
  case EOpConstructI16Vec3:
    pcVar3 = "Construct i16vec3";
    break;
  case EOpConstructI16Vec4:
    pcVar3 = "Construct i16vec4";
    break;
  case EOpConstructU16Vec2:
    pcVar3 = "Construct u16vec2";
    break;
  case EOpConstructU16Vec3:
    pcVar3 = "Construct u16vec3";
    break;
  case EOpConstructU16Vec4:
    pcVar3 = "Construct u16vec4";
    break;
  case EOpConstructIVec2:
    pcVar3 = "Construct ivec2";
    break;
  case EOpConstructIVec3:
    pcVar3 = "Construct ivec3";
    break;
  case EOpConstructIVec4:
    pcVar3 = "Construct ivec4";
    break;
  case EOpConstructUVec2:
    pcVar3 = "Construct uvec2";
    break;
  case EOpConstructUVec3:
    pcVar3 = "Construct uvec3";
    break;
  case EOpConstructUVec4:
    pcVar3 = "Construct uvec4";
    break;
  case EOpConstructI64Vec2:
    pcVar3 = "Construct i64vec2";
    break;
  case EOpConstructI64Vec3:
    pcVar3 = "Construct i64vec3";
    break;
  case EOpConstructI64Vec4:
    pcVar3 = "Construct i64vec4";
    break;
  case EOpConstructU64Vec2:
    pcVar3 = "Construct u64vec2";
    break;
  case EOpConstructU64Vec3:
    pcVar3 = "Construct u64vec3";
    break;
  case EOpConstructU64Vec4:
    pcVar3 = "Construct u64vec4";
    break;
  case EOpConstructDMat2x2:
    pcVar3 = "Construct dmat2";
    break;
  case EOpConstructDMat2x3:
    pcVar3 = "Construct dmat2x3";
    break;
  case EOpConstructDMat2x4:
    pcVar3 = "Construct dmat2x4";
    break;
  case EOpConstructDMat3x2:
    pcVar3 = "Construct dmat3x2";
    break;
  case EOpConstructDMat3x3:
    pcVar3 = "Construct dmat3";
    break;
  case EOpConstructDMat3x4:
    pcVar3 = "Construct dmat3x4";
    break;
  case EOpConstructDMat4x2:
    pcVar3 = "Construct dmat4x2";
    break;
  case EOpConstructDMat4x3:
    pcVar3 = "Construct dmat4x3";
    break;
  case EOpConstructDMat4x4:
    pcVar3 = "Construct dmat4";
    break;
  case EOpConstructIMat2x2:
    pcVar3 = "Construct imat2";
    break;
  case EOpConstructIMat2x3:
    pcVar3 = "Construct imat2x3";
    break;
  case EOpConstructIMat2x4:
    pcVar3 = "Construct imat2x4";
    break;
  case EOpConstructIMat3x2:
    pcVar3 = "Construct imat3x2";
    break;
  case EOpConstructIMat3x3:
    pcVar3 = "Construct imat3";
    break;
  case EOpConstructIMat3x4:
    pcVar3 = "Construct imat3x4";
    break;
  case EOpConstructIMat4x2:
    pcVar3 = "Construct imat4x2";
    break;
  case EOpConstructIMat4x3:
    pcVar3 = "Construct imat4x3";
    break;
  case EOpConstructIMat4x4:
    pcVar3 = "Construct imat4";
    break;
  case EOpConstructUMat2x2:
    pcVar3 = "Construct umat2";
    break;
  case EOpConstructUMat2x3:
    pcVar3 = "Construct umat2x3";
    break;
  case EOpConstructUMat2x4:
    pcVar3 = "Construct umat2x4";
    break;
  case EOpConstructUMat3x2:
    pcVar3 = "Construct umat3x2";
    break;
  case EOpConstructUMat3x3:
    pcVar3 = "Construct umat3";
    break;
  case EOpConstructUMat3x4:
    pcVar3 = "Construct umat3x4";
    break;
  case EOpConstructUMat4x2:
    pcVar3 = "Construct umat4x2";
    break;
  case EOpConstructUMat4x3:
    pcVar3 = "Construct umat4x3";
    break;
  case EOpConstructUMat4x4:
    pcVar3 = "Construct umat4";
    break;
  case EOpConstructBMat2x2:
    pcVar3 = "Construct bmat2";
    break;
  case EOpConstructBMat2x3:
    pcVar3 = "Construct bmat2x3";
    break;
  case EOpConstructBMat2x4:
    pcVar3 = "Construct bmat2x4";
    break;
  case EOpConstructBMat3x2:
    pcVar3 = "Construct bmat3x2";
    break;
  case EOpConstructBMat3x3:
    pcVar3 = "Construct bmat3";
    break;
  case EOpConstructBMat3x4:
    pcVar3 = "Construct bmat3x4";
    break;
  case EOpConstructBMat4x2:
    pcVar3 = "Construct bmat4x2";
    break;
  case EOpConstructBMat4x3:
    pcVar3 = "Construct bmat4x3";
    break;
  case EOpConstructBMat4x4:
    pcVar3 = "Construct bmat4";
    break;
  case EOpConstructFloat16:
    pcVar3 = "Construct float16_t";
    break;
  case EOpConstructF16Vec2:
    pcVar3 = "Construct f16vec2";
    break;
  case EOpConstructF16Vec3:
    pcVar3 = "Construct f16vec3";
    break;
  case EOpConstructF16Vec4:
    pcVar3 = "Construct f16vec4";
    break;
  case EOpConstructF16Mat2x2:
    pcVar3 = "Construct f16mat2";
    break;
  case EOpConstructF16Mat2x3:
    pcVar3 = "Construct f16mat2x3";
    break;
  case EOpConstructF16Mat2x4:
    pcVar3 = "Construct f16mat2x4";
    break;
  case EOpConstructF16Mat3x2:
    pcVar3 = "Construct f16mat3x2";
    break;
  case EOpConstructF16Mat3x3:
    pcVar3 = "Construct f16mat3";
    break;
  case EOpConstructF16Mat3x4:
    pcVar3 = "Construct f16mat3x4";
    break;
  case EOpConstructF16Mat4x2:
    pcVar3 = "Construct f16mat4x2";
    break;
  case EOpConstructF16Mat4x3:
    pcVar3 = "Construct f16mat4x3";
    break;
  case EOpConstructF16Mat4x4:
    pcVar3 = "Construct f16mat4";
    break;
  case EOpConstructStruct:
    pcVar3 = "Construct structure";
    break;
  case EOpConstructTextureSampler:
    pcVar3 = "Construct combined texture-sampler";
    break;
  case EOpConstructReference:
    pcVar3 = "Construct reference";
    break;
  case EOpConstructCooperativeMatrixNV:
    pcVar3 = "Construct cooperative matrix NV";
    break;
  case EOpConstructCooperativeMatrixKHR:
    pcVar3 = "Construct cooperative matrix KHR";
    break;
  case EOpConstructCooperativeVectorNV:
    pcVar3 = "Construct cooperative vector NV";
    break;
  case EOpConstructAccStruct:
    pcVar3 = "Construct acceleration structure";
    break;
  case EOpImageQuerySize:
    pcVar3 = "imageQuerySize";
    break;
  case EOpImageQuerySamples:
    pcVar3 = "imageQuerySamples";
    break;
  case EOpImageLoad:
    pcVar3 = "imageLoad";
    break;
  case EOpImageStore:
    pcVar3 = "imageStore";
    break;
  case EOpImageLoadLod:
    pcVar3 = "imageLoadLod";
    break;
  case EOpImageStoreLod:
    pcVar3 = "imageStoreLod";
    break;
  case EOpImageAtomicAdd:
    pcVar3 = "imageAtomicAdd";
    break;
  case EOpImageAtomicMin:
    pcVar3 = "imageAtomicMin";
    break;
  case EOpImageAtomicMax:
    pcVar3 = "imageAtomicMax";
    break;
  case EOpImageAtomicAnd:
    pcVar3 = "imageAtomicAnd";
    break;
  case EOpImageAtomicOr:
    pcVar3 = "imageAtomicOr";
    break;
  case EOpImageAtomicXor:
    pcVar3 = "imageAtomicXor";
    break;
  case EOpImageAtomicExchange:
    pcVar3 = "imageAtomicExchange";
    break;
  case EOpImageAtomicCompSwap:
    pcVar3 = "imageAtomicCompSwap";
    break;
  case EOpImageAtomicLoad:
    pcVar3 = "imageAtomicLoad";
    break;
  case EOpImageAtomicStore:
    pcVar3 = "imageAtomicStore";
    break;
  case EOpSubpassLoad:
    pcVar3 = "subpassLoad";
    break;
  case EOpSubpassLoadMS:
    pcVar3 = "subpassLoadMS";
    break;
  case EOpSparseImageLoad:
    pcVar3 = "sparseImageLoad";
    break;
  case EOpSparseImageLoadLod:
    pcVar3 = "sparseImageLoadLod";
    break;
  case EOpColorAttachmentReadEXT:
    pcVar3 = "colorAttachmentReadEXT";
    break;
  case EOpTextureQuerySize:
    pcVar3 = "textureSize";
    break;
  case EOpTextureQueryLod:
    pcVar3 = "textureQueryLod";
    break;
  case EOpTextureQueryLevels:
    pcVar3 = "textureQueryLevels";
    break;
  case EOpTextureQuerySamples:
    pcVar3 = "textureSamples";
    break;
  case EOpTexture:
    pcVar3 = "texture";
    break;
  case EOpTextureProj:
    pcVar3 = "textureProj";
    break;
  case EOpTextureLod:
    pcVar3 = "textureLod";
    break;
  case EOpTextureOffset:
    pcVar3 = "textureOffset";
    break;
  case EOpTextureFetch:
    pcVar3 = "textureFetch";
    break;
  case EOpTextureFetchOffset:
    pcVar3 = "textureFetchOffset";
    break;
  case EOpTextureProjOffset:
    pcVar3 = "textureProjOffset";
    break;
  case EOpTextureLodOffset:
    pcVar3 = "textureLodOffset";
    break;
  case EOpTextureProjLod:
    pcVar3 = "textureProjLod";
    break;
  case EOpTextureProjLodOffset:
    pcVar3 = "textureProjLodOffset";
    break;
  case EOpTextureGrad:
    pcVar3 = "textureGrad";
    break;
  case EOpTextureGradOffset:
    pcVar3 = "textureGradOffset";
    break;
  case EOpTextureProjGrad:
    pcVar3 = "textureProjGrad";
    break;
  case EOpTextureProjGradOffset:
    pcVar3 = "textureProjGradOffset";
    break;
  case EOpTextureGather:
    pcVar3 = "textureGather";
    break;
  case EOpTextureGatherOffset:
    pcVar3 = "textureGatherOffset";
    break;
  case EOpTextureGatherOffsets:
    pcVar3 = "textureGatherOffsets";
    break;
  case EOpTextureClamp:
    pcVar3 = "textureClamp";
    break;
  case EOpTextureOffsetClamp:
    pcVar3 = "textureOffsetClamp";
    break;
  case EOpTextureGradClamp:
    pcVar3 = "textureGradClamp";
    break;
  case EOpTextureGradOffsetClamp:
    pcVar3 = "textureGradOffsetClamp";
    break;
  case EOpTextureGatherLod:
    pcVar3 = "textureGatherLod";
    break;
  case EOpTextureGatherLodOffset:
    pcVar3 = "textureGatherLodOffset";
    break;
  case EOpTextureGatherLodOffsets:
    pcVar3 = "textureGatherLodOffsets";
    break;
  case EOpSparseTexture:
    pcVar3 = "sparseTexture";
    break;
  case EOpSparseTextureLod:
    pcVar3 = "sparseTextureLod";
    break;
  case EOpSparseTextureOffset:
    pcVar3 = "sparseTextureOffset";
    break;
  case EOpSparseTextureFetch:
    pcVar3 = "sparseTexelFetch";
    break;
  case EOpSparseTextureFetchOffset:
    pcVar3 = "sparseTexelFetchOffset";
    break;
  case EOpSparseTextureLodOffset:
    pcVar3 = "sparseTextureLodOffset";
    break;
  case EOpSparseTextureGrad:
    pcVar3 = "sparseTextureGrad";
    break;
  case EOpSparseTextureGradOffset:
    pcVar3 = "sparseTextureGradOffset";
    break;
  case EOpSparseTextureGather:
    pcVar3 = "sparseTextureGather";
    break;
  case EOpSparseTextureGatherOffset:
    pcVar3 = "sparseTextureGatherOffset";
    break;
  case EOpSparseTextureGatherOffsets:
    pcVar3 = "sparseTextureGatherOffsets";
    break;
  case EOpSparseTextureClamp:
    pcVar3 = "sparseTextureClamp";
    break;
  case EOpSparseTextureOffsetClamp:
    pcVar3 = "sparseTextureOffsetClamp";
    break;
  case EOpSparseTextureGradClamp:
    pcVar3 = "sparseTextureGradClamp";
    break;
  case EOpSparseTextureGradOffsetClamp:
    pcVar3 = "sparseTextureGradOffsetClam";
    break;
  case EOpSparseTextureGatherLod:
    pcVar3 = "sparseTextureGatherLod";
    break;
  case EOpSparseTextureGatherLodOffset:
    pcVar3 = "sparseTextureGatherLodOffset";
    break;
  case EOpSparseTextureGatherLodOffsets:
    pcVar3 = "sparseTextureGatherLodOffsets";
    break;
  case EOpImageSampleFootprintNV:
    pcVar3 = "imageSampleFootprintNV";
    break;
  case EOpImageSampleFootprintClampNV:
    pcVar3 = "imageSampleFootprintClampNV";
    break;
  case EOpImageSampleFootprintLodNV:
    pcVar3 = "imageSampleFootprintLodNV";
    break;
  case EOpImageSampleFootprintGradNV:
    pcVar3 = "imageSampleFootprintGradNV";
    break;
  case EOpImageSampleFootprintGradClampNV:
    pcVar3 = "mageSampleFootprintGradClampNV";
    break;
  case EOpAddCarry:
    pcVar3 = "addCarry";
    break;
  case EOpSubBorrow:
    pcVar3 = "subBorrow";
    break;
  case EOpUMulExtended:
    pcVar3 = "uMulExtended";
    break;
  case EOpIMulExtended:
    pcVar3 = "iMulExtended";
    break;
  case EOpBitfieldExtract:
    pcVar3 = "bitfieldExtract";
    break;
  case EOpBitfieldInsert:
    pcVar3 = "bitfieldInsert";
    break;
  case EOpTraceNV:
    pcVar3 = "traceNV";
    break;
  case EOpTraceRayMotionNV:
    pcVar3 = "traceRayMotionNV";
    break;
  case EOpTraceKHR:
    pcVar3 = "traceRayKHR";
    break;
  case EOpReportIntersection:
    pcVar3 = "reportIntersectionNV";
    break;
  case EOpIgnoreIntersectionNV:
    pcVar3 = "ignoreIntersectionNV";
    break;
  case EOpTerminateRayNV:
    pcVar3 = "terminateRayNV";
    break;
  case EOpExecuteCallableNV:
    pcVar3 = "executeCallableNV";
    break;
  case EOpExecuteCallableKHR:
    pcVar3 = "executeCallableKHR";
    break;
  case EOpWritePackedPrimitiveIndices4x8NV:
    pcVar3 = "writePackedPrimitiveIndices4x8NV";
    break;
  case EOpEmitMeshTasksEXT:
    pcVar3 = "EmitMeshTasksEXT";
    break;
  case EOpSetMeshOutputsEXT:
    pcVar3 = "SetMeshOutputsEXT";
    break;
  case EOpRayQueryInitialize:
    pcVar3 = "rayQueryInitializeEXT";
    break;
  case EOpRayQueryTerminate:
    pcVar3 = "rayQueryTerminateEXT";
    break;
  case EOpRayQueryGenerateIntersection:
    pcVar3 = "rayQueryGenerateIntersectionEXT";
    break;
  case EOpRayQueryConfirmIntersection:
    pcVar3 = "rayQueryConfirmIntersectionEXT";
    break;
  case EOpRayQueryProceed:
    pcVar3 = "rayQueryProceedEXT";
    break;
  case EOpRayQueryGetIntersectionType:
    pcVar3 = "rayQueryGetIntersectionTypeEXT";
    break;
  case EOpRayQueryGetRayTMin:
    pcVar3 = "rayQueryGetRayTMinEXT";
    break;
  case EOpRayQueryGetRayFlags:
    pcVar3 = "rayQueryGetRayFlagsEXT";
    break;
  case EOpRayQueryGetIntersectionT:
    pcVar3 = "rayQueryGetIntersectionTEXT";
    break;
  case EOpRayQueryGetIntersectionInstanceCustomIndex:
    pcVar3 = "rayQueryGetIntersectionInstanceCustomIndexEXT";
    break;
  case EOpRayQueryGetIntersectionInstanceId:
    pcVar3 = "rayQueryGetIntersectionInstanceIdEXT";
    break;
  case EOpRayQueryGetIntersectionInstanceShaderBindingTableRecordOffset:
    pcVar3 = "rayQueryGetIntersectionInstanceShaderBindingTableRecordOffsetEXT";
    break;
  case EOpRayQueryGetIntersectionGeometryIndex:
    pcVar3 = "rayQueryGetIntersectionGeometryIndexEXT";
    break;
  case EOpRayQueryGetIntersectionPrimitiveIndex:
    pcVar3 = "rayQueryGetIntersectionPrimitiveIndexEXT";
    break;
  case EOpRayQueryGetIntersectionBarycentrics:
    pcVar3 = "rayQueryGetIntersectionBarycentricsEXT";
    break;
  case EOpRayQueryGetIntersectionFrontFace:
    pcVar3 = "rayQueryGetIntersectionFrontFaceEXT";
    break;
  case EOpRayQueryGetIntersectionCandidateAABBOpaque:
    pcVar3 = "rayQueryGetIntersectionCandidateAABBOpaqueEXT";
    break;
  case EOpRayQueryGetIntersectionObjectRayDirection:
    pcVar3 = "rayQueryGetIntersectionObjectRayDirectionEXT";
    break;
  case EOpRayQueryGetIntersectionObjectRayOrigin:
    pcVar3 = "rayQueryGetIntersectionObjectRayOriginEXT";
    break;
  case EOpRayQueryGetWorldRayDirection:
    pcVar3 = "rayQueryGetWorldRayDirectionEXT";
    break;
  case EOpRayQueryGetWorldRayOrigin:
    pcVar3 = "rayQueryGetWorldRayOriginEXT";
    break;
  case EOpRayQueryGetIntersectionObjectToWorld:
    pcVar3 = "rayQueryGetIntersectionObjectToWorldEXT";
    break;
  case EOpRayQueryGetIntersectionWorldToObject:
    pcVar3 = "rayQueryGetIntersectionWorldToObjectEXT";
    break;
  case EOpHitObjectTraceRayNV:
    pcVar3 = "HitObjectTraceRayNV";
    break;
  case EOpHitObjectTraceRayMotionNV:
    pcVar3 = "HitObjectTraceRayMotionNV";
    break;
  case EOpHitObjectRecordHitNV:
    pcVar3 = "HitObjectRecordHitNV";
    break;
  case EOpHitObjectRecordHitMotionNV:
    pcVar3 = "HitObjectRecordHitMotionNV";
    break;
  case EOpHitObjectRecordHitWithIndexNV:
    pcVar3 = "HitObjectRecordHitWithIndexNV";
    break;
  case EOpHitObjectRecordHitWithIndexMotionNV:
    pcVar3 = "HitObjectRecordHitWithIndexMotionNV";
    break;
  case EOpHitObjectRecordMissNV:
    pcVar3 = "HitObjectRecordMissNV";
    break;
  case EOpHitObjectRecordMissMotionNV:
    pcVar3 = "HitObjectRecordMissMotionNV";
    break;
  case EOpHitObjectRecordEmptyNV:
    pcVar3 = "HitObjectRecordEmptyNV";
    break;
  case EOpHitObjectExecuteShaderNV:
    pcVar3 = "HitObjectExecuteShaderNV";
    break;
  case EOpHitObjectIsEmptyNV:
    pcVar3 = "HitObjectIsEmptyNV";
    break;
  case EOpHitObjectIsMissNV:
    pcVar3 = "HitObjectIsMissNV";
    break;
  case EOpHitObjectIsHitNV:
    pcVar3 = "HitObjectIsHitNV";
    break;
  case EOpHitObjectGetRayTMinNV:
    pcVar3 = "HitObjectGetRayTMinNV";
    break;
  case EOpHitObjectGetRayTMaxNV:
    pcVar3 = "HitObjectGetRayTMaxNV";
    break;
  case EOpHitObjectGetObjectRayOriginNV:
    pcVar3 = "HitObjectGetObjectRayOriginNV";
    break;
  case EOpHitObjectGetObjectRayDirectionNV:
    pcVar3 = "HitObjectGetObjectRayDirectionNV";
    break;
  case EOpHitObjectGetWorldRayOriginNV:
    pcVar3 = "HitObjectGetWorldRayOriginNV";
    break;
  case EOpHitObjectGetWorldRayDirectionNV:
    pcVar3 = "HitObjectGetWorldRayDirectionNV";
    break;
  case EOpHitObjectGetWorldToObjectNV:
    pcVar3 = "HitObjectGetWorldToObjectNV";
    break;
  case EOpHitObjectGetObjectToWorldNV:
    pcVar3 = "HitObjectGetObjectToWorldNV";
    break;
  case EOpHitObjectGetInstanceCustomIndexNV:
    pcVar3 = "HitObjectGetInstanceCustomIndexNV";
    break;
  case EOpHitObjectGetInstanceIdNV:
    pcVar3 = "HitObjectGetInstaneIdNV";
    break;
  case EOpHitObjectGetGeometryIndexNV:
    pcVar3 = "HitObjectGetGeometryIndexNV";
    break;
  case EOpHitObjectGetPrimitiveIndexNV:
    pcVar3 = "HitObjectGetPrimitiveIndexNV";
    break;
  case EOpHitObjectGetHitKindNV:
    pcVar3 = "HitObjectGetHitKindNV";
    break;
  case EOpHitObjectGetShaderBindingTableRecordIndexNV:
    pcVar3 = "HitObjectGetShaderBindingTableRecordIndexNV";
    break;
  case EOpHitObjectGetShaderRecordBufferHandleNV:
    pcVar3 = "HitObjectReadShaderRecordBufferHandleNV";
    break;
  case EOpHitObjectGetAttributesNV:
    pcVar3 = "HitObjectGetAttributesNV";
    break;
  case EOpHitObjectGetCurrentTimeNV:
    pcVar3 = "HitObjectGetCurrentTimeNV";
    break;
  case EOpReorderThreadNV:
    pcVar3 = "ReorderThreadNV";
    break;
  case EOpFetchMicroTriangleVertexPositionNV:
    pcVar3 = "MicroTriangleVertexPositionNV";
    break;
  case EOpFetchMicroTriangleVertexBarycentricNV:
    pcVar3 = "MicroTriangleVertexBarycentricNV";
    break;
  case EOpSinCos:
    pcVar3 = "sincos";
    break;
  case EOpGenMul:
    pcVar3 = "mul";
    break;
  case EOpAllMemoryBarrierWithGroupSync:
    pcVar3 = "AllMemoryBarrierWithGroupSync";
    break;
  case EOpDeviceMemoryBarrier:
    pcVar3 = "DeviceMemoryBarrier";
    break;
  case EOpDeviceMemoryBarrierWithGroupSync:
    pcVar3 = "DeviceMemoryBarrierWithGroupSync";
    break;
  case EOpWorkgroupMemoryBarrier:
    pcVar3 = "WorkgroupMemoryBarrier";
    break;
  case EOpWorkgroupMemoryBarrierWithGroupSync:
    pcVar3 = "WorkgroupMemoryBarrierWithGroupSync";
    break;
  case EOpRayQueryGetIntersectionTriangleVertexPositionsEXT:
    pcVar3 = "rayQueryGetIntersectionTriangleVertexPositionsEXT";
    break;
  case EOpStencilAttachmentReadEXT:
    pcVar3 = "stencilAttachmentReadEXT";
    break;
  case EOpDepthAttachmentReadEXT:
    pcVar3 = "depthAttachmentReadEXT";
    break;
  case EOpRayQueryGetIntersectionClusterIdNV:
    pcVar3 = "rayQueryGetIntersectionClusterIdNV";
    break;
  case EOpHitObjectGetClusterIdNV:
    pcVar3 = "HitObjectGetClusterIdNV";
    break;
  case EOpRayQueryGetIntersectionSpherePositionNV:
    pcVar3 = "rayQueryGetIntersectionSpherePositionNV";
    break;
  case EOpRayQueryGetIntersectionSphereRadiusNV:
    pcVar3 = "rayQueryGetIntersectionSphereRadiusNV";
    break;
  case EOpRayQueryGetIntersectionLSSHitValueNV:
    pcVar3 = "rayQueryGetIntersectionLSSHitValueNV";
    break;
  case EOpRayQueryGetIntersectionLSSPositionsNV:
    pcVar3 = "rayQueryGetIntersectionLSSPositionsNV";
    break;
  case EOpRayQueryGetIntersectionLSSRadiiNV:
    pcVar3 = "rayQueryGetIntersectionLSSRadiiNV";
    break;
  case EOpRayQueryIsSphereHitNV:
    pcVar3 = "rayQueryIsSphereHitNV";
    break;
  case EOpRayQueryIsLSSHitNV:
    pcVar3 = "rayQueryIsLSSHitNV";
    break;
  case EOpHitObjectGetSpherePositionNV:
    pcVar3 = "HitObjectGetSpherePositionNV";
    break;
  case EOpHitObjectGetSphereRadiusNV:
    pcVar3 = "HitObjectGetSphereRadiusNV";
    break;
  case EOpHitObjectGetLSSPositionsNV:
    pcVar3 = "HitObjectGetLSSPositionsNV";
    break;
  case EOpHitObjectGetLSSRadiiNV:
    pcVar3 = "HitObjectGetLSSRadiiNV";
    break;
  case EOpHitObjectIsSphereHitNV:
    pcVar3 = "HitObjectIsSphereHitNV";
    break;
  case EOpHitObjectIsLSSHitNV:
    pcVar3 = "HitObjectIsLSSHitNV";
  }
  TInfoSinkBase::append(this_00,pcVar3);
LAB_002fb157:
  TVar1 = (node->super_TIntermOperator).op;
  if ((EOpParameters < TVar1) || ((0x46U >> (TVar1 & EOpLeftShift) & 1) == 0)) {
    TInfoSinkBase::append(this_00," (");
    TIntermOperator::getCompleteString_abi_cxx11_(&local_40,&node->super_TIntermOperator);
    TInfoSinkBase::append(this_00,&local_40);
    TInfoSinkBase::append(this_00,")");
  }
  pcVar3 = "\n";
LAB_002fb1ab:
  TInfoSinkBase::append(this_00,pcVar3);
  return true;
}

Assistant:

bool TOutputTraverser::visitAggregate(TVisit /* visit */, TIntermAggregate* node)
{
    TInfoSink& out = infoSink;

    if (node->getOp() == EOpNull) {
        out.debug.message(EPrefixError, "node is still EOpNull!");
        return true;
    }

    OutputTreeText(out, node, depth);

    switch (node->getOp()) {
    case EOpSequence:      out.debug << "Sequence\n";       return true;
    case EOpScope:         out.debug << "Scope\n";       return true;
    case EOpLinkerObjects: out.debug << "Linker Objects\n"; return true;
    case EOpComma:         out.debug << "Comma";            break;
    case EOpFunction:      out.debug << "Function Definition: " << node->getName(); break;
    case EOpFunctionCall:  out.debug << "Function Call: "       << node->getName(); break;
    case EOpParameters:    out.debug << "Function Parameters: ";                    break;

    case EOpConstructFloat: out.debug << "Construct float"; break;
    case EOpConstructDouble:out.debug << "Construct double"; break;

    case EOpConstructVec2:  out.debug << "Construct vec2";  break;
    case EOpConstructVec3:  out.debug << "Construct vec3";  break;
    case EOpConstructVec4:  out.debug << "Construct vec4";  break;
    case EOpConstructDVec2: out.debug << "Construct dvec2";  break;
    case EOpConstructDVec3: out.debug << "Construct dvec3";  break;
    case EOpConstructDVec4: out.debug << "Construct dvec4";  break;
    case EOpConstructBool:  out.debug << "Construct bool";  break;
    case EOpConstructBVec2: out.debug << "Construct bvec2"; break;
    case EOpConstructBVec3: out.debug << "Construct bvec3"; break;
    case EOpConstructBVec4: out.debug << "Construct bvec4"; break;
    case EOpConstructInt8:   out.debug << "Construct int8_t";   break;
    case EOpConstructI8Vec2: out.debug << "Construct i8vec2"; break;
    case EOpConstructI8Vec3: out.debug << "Construct i8vec3"; break;
    case EOpConstructI8Vec4: out.debug << "Construct i8vec4"; break;
    case EOpConstructInt:   out.debug << "Construct int";   break;
    case EOpConstructIVec2: out.debug << "Construct ivec2"; break;
    case EOpConstructIVec3: out.debug << "Construct ivec3"; break;
    case EOpConstructIVec4: out.debug << "Construct ivec4"; break;
    case EOpConstructUint8:    out.debug << "Construct uint8_t";    break;
    case EOpConstructU8Vec2:   out.debug << "Construct u8vec2";   break;
    case EOpConstructU8Vec3:   out.debug << "Construct u8vec3";   break;
    case EOpConstructU8Vec4:   out.debug << "Construct u8vec4";   break;
    case EOpConstructUint:    out.debug << "Construct uint";    break;
    case EOpConstructUVec2:   out.debug << "Construct uvec2";   break;
    case EOpConstructUVec3:   out.debug << "Construct uvec3";   break;
    case EOpConstructUVec4:   out.debug << "Construct uvec4";   break;
    case EOpConstructInt64:   out.debug << "Construct int64"; break;
    case EOpConstructI64Vec2: out.debug << "Construct i64vec2"; break;
    case EOpConstructI64Vec3: out.debug << "Construct i64vec3"; break;
    case EOpConstructI64Vec4: out.debug << "Construct i64vec4"; break;
    case EOpConstructUint64:  out.debug << "Construct uint64"; break;
    case EOpConstructU64Vec2: out.debug << "Construct u64vec2"; break;
    case EOpConstructU64Vec3: out.debug << "Construct u64vec3"; break;
    case EOpConstructU64Vec4: out.debug << "Construct u64vec4"; break;
    case EOpConstructInt16:   out.debug << "Construct int16_t"; break;
    case EOpConstructI16Vec2: out.debug << "Construct i16vec2"; break;
    case EOpConstructI16Vec3: out.debug << "Construct i16vec3"; break;
    case EOpConstructI16Vec4: out.debug << "Construct i16vec4"; break;
    case EOpConstructUint16:  out.debug << "Construct uint16_t"; break;
    case EOpConstructU16Vec2: out.debug << "Construct u16vec2"; break;
    case EOpConstructU16Vec3: out.debug << "Construct u16vec3"; break;
    case EOpConstructU16Vec4: out.debug << "Construct u16vec4"; break;
    case EOpConstructMat2x2:  out.debug << "Construct mat2";    break;
    case EOpConstructMat2x3:  out.debug << "Construct mat2x3";  break;
    case EOpConstructMat2x4:  out.debug << "Construct mat2x4";  break;
    case EOpConstructMat3x2:  out.debug << "Construct mat3x2";  break;
    case EOpConstructMat3x3:  out.debug << "Construct mat3";    break;
    case EOpConstructMat3x4:  out.debug << "Construct mat3x4";  break;
    case EOpConstructMat4x2:  out.debug << "Construct mat4x2";  break;
    case EOpConstructMat4x3:  out.debug << "Construct mat4x3";  break;
    case EOpConstructMat4x4:  out.debug << "Construct mat4";    break;
    case EOpConstructDMat2x2: out.debug << "Construct dmat2";   break;
    case EOpConstructDMat2x3: out.debug << "Construct dmat2x3"; break;
    case EOpConstructDMat2x4: out.debug << "Construct dmat2x4"; break;
    case EOpConstructDMat3x2: out.debug << "Construct dmat3x2"; break;
    case EOpConstructDMat3x3: out.debug << "Construct dmat3";   break;
    case EOpConstructDMat3x4: out.debug << "Construct dmat3x4"; break;
    case EOpConstructDMat4x2: out.debug << "Construct dmat4x2"; break;
    case EOpConstructDMat4x3: out.debug << "Construct dmat4x3"; break;
    case EOpConstructDMat4x4: out.debug << "Construct dmat4";   break;
    case EOpConstructIMat2x2: out.debug << "Construct imat2";   break;
    case EOpConstructIMat2x3: out.debug << "Construct imat2x3"; break;
    case EOpConstructIMat2x4: out.debug << "Construct imat2x4"; break;
    case EOpConstructIMat3x2: out.debug << "Construct imat3x2"; break;
    case EOpConstructIMat3x3: out.debug << "Construct imat3";   break;
    case EOpConstructIMat3x4: out.debug << "Construct imat3x4"; break;
    case EOpConstructIMat4x2: out.debug << "Construct imat4x2"; break;
    case EOpConstructIMat4x3: out.debug << "Construct imat4x3"; break;
    case EOpConstructIMat4x4: out.debug << "Construct imat4";   break;
    case EOpConstructUMat2x2: out.debug << "Construct umat2";   break;
    case EOpConstructUMat2x3: out.debug << "Construct umat2x3"; break;
    case EOpConstructUMat2x4: out.debug << "Construct umat2x4"; break;
    case EOpConstructUMat3x2: out.debug << "Construct umat3x2"; break;
    case EOpConstructUMat3x3: out.debug << "Construct umat3";   break;
    case EOpConstructUMat3x4: out.debug << "Construct umat3x4"; break;
    case EOpConstructUMat4x2: out.debug << "Construct umat4x2"; break;
    case EOpConstructUMat4x3: out.debug << "Construct umat4x3"; break;
    case EOpConstructUMat4x4: out.debug << "Construct umat4";   break;
    case EOpConstructBMat2x2: out.debug << "Construct bmat2";   break;
    case EOpConstructBMat2x3: out.debug << "Construct bmat2x3"; break;
    case EOpConstructBMat2x4: out.debug << "Construct bmat2x4"; break;
    case EOpConstructBMat3x2: out.debug << "Construct bmat3x2"; break;
    case EOpConstructBMat3x3: out.debug << "Construct bmat3";   break;
    case EOpConstructBMat3x4: out.debug << "Construct bmat3x4"; break;
    case EOpConstructBMat4x2: out.debug << "Construct bmat4x2"; break;
    case EOpConstructBMat4x3: out.debug << "Construct bmat4x3"; break;
    case EOpConstructBMat4x4: out.debug << "Construct bmat4";   break;
    case EOpConstructFloat16:   out.debug << "Construct float16_t"; break;
    case EOpConstructF16Vec2:   out.debug << "Construct f16vec2";   break;
    case EOpConstructF16Vec3:   out.debug << "Construct f16vec3";   break;
    case EOpConstructF16Vec4:   out.debug << "Construct f16vec4";   break;
    case EOpConstructF16Mat2x2: out.debug << "Construct f16mat2";   break;
    case EOpConstructF16Mat2x3: out.debug << "Construct f16mat2x3"; break;
    case EOpConstructF16Mat2x4: out.debug << "Construct f16mat2x4"; break;
    case EOpConstructF16Mat3x2: out.debug << "Construct f16mat3x2"; break;
    case EOpConstructF16Mat3x3: out.debug << "Construct f16mat3";   break;
    case EOpConstructF16Mat3x4: out.debug << "Construct f16mat3x4"; break;
    case EOpConstructF16Mat4x2: out.debug << "Construct f16mat4x2"; break;
    case EOpConstructF16Mat4x3: out.debug << "Construct f16mat4x3"; break;
    case EOpConstructF16Mat4x4: out.debug << "Construct f16mat4";   break;
    case EOpConstructStruct:  out.debug << "Construct structure";  break;
    case EOpConstructTextureSampler: out.debug << "Construct combined texture-sampler"; break;
    case EOpConstructReference:  out.debug << "Construct reference";  break;
    case EOpConstructCooperativeMatrixNV:  out.debug << "Construct cooperative matrix NV";  break;
    case EOpConstructCooperativeMatrixKHR:  out.debug << "Construct cooperative matrix KHR";  break;
    case EOpConstructCooperativeVectorNV:  out.debug << "Construct cooperative vector NV";  break;
    case EOpConstructAccStruct: out.debug << "Construct acceleration structure"; break;

    case EOpLessThan:         out.debug << "Compare Less Than";             break;
    case EOpGreaterThan:      out.debug << "Compare Greater Than";          break;
    case EOpLessThanEqual:    out.debug << "Compare Less Than or Equal";    break;
    case EOpGreaterThanEqual: out.debug << "Compare Greater Than or Equal"; break;
    case EOpVectorEqual:      out.debug << "Equal";                         break;
    case EOpVectorNotEqual:   out.debug << "NotEqual";                      break;

    case EOpMod:           out.debug << "mod";         break;
    case EOpModf:          out.debug << "modf";        break;
    case EOpPow:           out.debug << "pow";         break;

    case EOpAtan:          out.debug << "arc tangent"; break;

    case EOpMin:           out.debug << "min";         break;
    case EOpMax:           out.debug << "max";         break;
    case EOpClamp:         out.debug << "clamp";       break;
    case EOpMix:           out.debug << "mix";         break;
    case EOpStep:          out.debug << "step";        break;
    case EOpSmoothStep:    out.debug << "smoothstep";  break;

    case EOpDistance:      out.debug << "distance";                break;
    case EOpDot:           out.debug << "dot-product";             break;
    case EOpDotPackedEXT:  out.debug << "dot-product-packed";break;
    case EOpDotAccSatEXT:  out.debug << "dot-product-accumulate-saturate";break;
    case EOpDotPackedAccSatEXT:  out.debug << "dot-product-packed-accumulate-saturate";break;
    case EOpCross:         out.debug << "cross-product";           break;
    case EOpFaceForward:   out.debug << "face-forward";            break;
    case EOpReflect:       out.debug << "reflect";                 break;
    case EOpRefract:       out.debug << "refract";                 break;
    case EOpMul:           out.debug << "component-wise multiply"; break;
    case EOpOuterProduct:  out.debug << "outer product";           break;

    case EOpEmitVertex:    out.debug << "EmitVertex";              break;
    case EOpEndPrimitive:  out.debug << "EndPrimitive";            break;

    case EOpBarrier:                    out.debug << "Barrier";                    break;
    case EOpMemoryBarrier:              out.debug << "MemoryBarrier";              break;
    case EOpMemoryBarrierAtomicCounter: out.debug << "MemoryBarrierAtomicCounter"; break;
    case EOpMemoryBarrierBuffer:        out.debug << "MemoryBarrierBuffer";        break;
    case EOpMemoryBarrierImage:         out.debug << "MemoryBarrierImage";         break;
    case EOpMemoryBarrierShared:        out.debug << "MemoryBarrierShared";        break;
    case EOpGroupMemoryBarrier:         out.debug << "GroupMemoryBarrier";         break;

    case EOpReadInvocation:             out.debug << "readInvocation";        break;

    case EOpSwizzleInvocations:         out.debug << "swizzleInvocations";       break;
    case EOpSwizzleInvocationsMasked:   out.debug << "swizzleInvocationsMasked"; break;
    case EOpWriteInvocation:            out.debug << "writeInvocation";          break;

    case EOpMin3:                       out.debug << "min3";                  break;
    case EOpMax3:                       out.debug << "max3";                  break;
    case EOpMid3:                       out.debug << "mid3";                  break;
    case EOpTime:                       out.debug << "time";                  break;

    case EOpAtomicAdd:                  out.debug << "AtomicAdd";             break;
    case EOpAtomicSubtract:             out.debug << "AtomicSubtract";        break;
    case EOpAtomicMin:                  out.debug << "AtomicMin";             break;
    case EOpAtomicMax:                  out.debug << "AtomicMax";             break;
    case EOpAtomicAnd:                  out.debug << "AtomicAnd";             break;
    case EOpAtomicOr:                   out.debug << "AtomicOr";              break;
    case EOpAtomicXor:                  out.debug << "AtomicXor";             break;
    case EOpAtomicExchange:             out.debug << "AtomicExchange";        break;
    case EOpAtomicCompSwap:             out.debug << "AtomicCompSwap";        break;
    case EOpAtomicLoad:                 out.debug << "AtomicLoad";            break;
    case EOpAtomicStore:                out.debug << "AtomicStore";           break;

    case EOpAtomicCounterAdd:           out.debug << "AtomicCounterAdd";      break;
    case EOpAtomicCounterSubtract:      out.debug << "AtomicCounterSubtract"; break;
    case EOpAtomicCounterMin:           out.debug << "AtomicCounterMin";      break;
    case EOpAtomicCounterMax:           out.debug << "AtomicCounterMax";      break;
    case EOpAtomicCounterAnd:           out.debug << "AtomicCounterAnd";      break;
    case EOpAtomicCounterOr:            out.debug << "AtomicCounterOr";       break;
    case EOpAtomicCounterXor:           out.debug << "AtomicCounterXor";      break;
    case EOpAtomicCounterExchange:      out.debug << "AtomicCounterExchange"; break;
    case EOpAtomicCounterCompSwap:      out.debug << "AtomicCounterCompSwap"; break;

    case EOpImageQuerySize:             out.debug << "imageQuerySize";        break;
    case EOpImageQuerySamples:          out.debug << "imageQuerySamples";     break;
    case EOpImageLoad:                  out.debug << "imageLoad";             break;
    case EOpImageStore:                 out.debug << "imageStore";            break;
    case EOpImageAtomicAdd:             out.debug << "imageAtomicAdd";        break;
    case EOpImageAtomicMin:             out.debug << "imageAtomicMin";        break;
    case EOpImageAtomicMax:             out.debug << "imageAtomicMax";        break;
    case EOpImageAtomicAnd:             out.debug << "imageAtomicAnd";        break;
    case EOpImageAtomicOr:              out.debug << "imageAtomicOr";         break;
    case EOpImageAtomicXor:             out.debug << "imageAtomicXor";        break;
    case EOpImageAtomicExchange:        out.debug << "imageAtomicExchange";   break;
    case EOpImageAtomicCompSwap:        out.debug << "imageAtomicCompSwap";   break;
    case EOpImageAtomicLoad:            out.debug << "imageAtomicLoad";       break;
    case EOpImageAtomicStore:           out.debug << "imageAtomicStore";      break;
    case EOpImageLoadLod:               out.debug << "imageLoadLod";          break;
    case EOpImageStoreLod:              out.debug << "imageStoreLod";         break;

    case EOpTextureQuerySize:           out.debug << "textureSize";           break;
    case EOpTextureQueryLod:            out.debug << "textureQueryLod";       break;
    case EOpTextureQueryLevels:         out.debug << "textureQueryLevels";    break;
    case EOpTextureQuerySamples:        out.debug << "textureSamples";        break;
    case EOpTexture:                    out.debug << "texture";               break;
    case EOpTextureProj:                out.debug << "textureProj";           break;
    case EOpTextureLod:                 out.debug << "textureLod";            break;
    case EOpTextureOffset:              out.debug << "textureOffset";         break;
    case EOpTextureFetch:               out.debug << "textureFetch";          break;
    case EOpTextureFetchOffset:         out.debug << "textureFetchOffset";    break;
    case EOpTextureProjOffset:          out.debug << "textureProjOffset";     break;
    case EOpTextureLodOffset:           out.debug << "textureLodOffset";      break;
    case EOpTextureProjLod:             out.debug << "textureProjLod";        break;
    case EOpTextureProjLodOffset:       out.debug << "textureProjLodOffset";  break;
    case EOpTextureGrad:                out.debug << "textureGrad";           break;
    case EOpTextureGradOffset:          out.debug << "textureGradOffset";     break;
    case EOpTextureProjGrad:            out.debug << "textureProjGrad";       break;
    case EOpTextureProjGradOffset:      out.debug << "textureProjGradOffset"; break;
    case EOpTextureGather:              out.debug << "textureGather";         break;
    case EOpTextureGatherOffset:        out.debug << "textureGatherOffset";   break;
    case EOpTextureGatherOffsets:       out.debug << "textureGatherOffsets";  break;
    case EOpTextureClamp:               out.debug << "textureClamp";          break;
    case EOpTextureOffsetClamp:         out.debug << "textureOffsetClamp";    break;
    case EOpTextureGradClamp:           out.debug << "textureGradClamp";      break;
    case EOpTextureGradOffsetClamp:     out.debug << "textureGradOffsetClamp";  break;
    case EOpTextureGatherLod:           out.debug << "textureGatherLod";        break;
    case EOpTextureGatherLodOffset:     out.debug << "textureGatherLodOffset";  break;
    case EOpTextureGatherLodOffsets:    out.debug << "textureGatherLodOffsets"; break;

    case EOpSparseTexture:                  out.debug << "sparseTexture";                   break;
    case EOpSparseTextureOffset:            out.debug << "sparseTextureOffset";             break;
    case EOpSparseTextureLod:               out.debug << "sparseTextureLod";                break;
    case EOpSparseTextureLodOffset:         out.debug << "sparseTextureLodOffset";          break;
    case EOpSparseTextureFetch:             out.debug << "sparseTexelFetch";                break;
    case EOpSparseTextureFetchOffset:       out.debug << "sparseTexelFetchOffset";          break;
    case EOpSparseTextureGrad:              out.debug << "sparseTextureGrad";               break;
    case EOpSparseTextureGradOffset:        out.debug << "sparseTextureGradOffset";         break;
    case EOpSparseTextureGather:            out.debug << "sparseTextureGather";             break;
    case EOpSparseTextureGatherOffset:      out.debug << "sparseTextureGatherOffset";       break;
    case EOpSparseTextureGatherOffsets:     out.debug << "sparseTextureGatherOffsets";      break;
    case EOpSparseImageLoad:                out.debug << "sparseImageLoad";                 break;
    case EOpSparseTextureClamp:             out.debug << "sparseTextureClamp";              break;
    case EOpSparseTextureOffsetClamp:       out.debug << "sparseTextureOffsetClamp";        break;
    case EOpSparseTextureGradClamp:         out.debug << "sparseTextureGradClamp";          break;
    case EOpSparseTextureGradOffsetClamp:   out.debug << "sparseTextureGradOffsetClam";     break;
    case EOpSparseTextureGatherLod:         out.debug << "sparseTextureGatherLod";          break;
    case EOpSparseTextureGatherLodOffset:   out.debug << "sparseTextureGatherLodOffset";    break;
    case EOpSparseTextureGatherLodOffsets:  out.debug << "sparseTextureGatherLodOffsets";   break;
    case EOpSparseImageLoadLod:             out.debug << "sparseImageLoadLod";              break;
    case EOpImageSampleFootprintNV:             out.debug << "imageSampleFootprintNV";          break;
    case EOpImageSampleFootprintClampNV:        out.debug << "imageSampleFootprintClampNV";     break;
    case EOpImageSampleFootprintLodNV:          out.debug << "imageSampleFootprintLodNV";       break;
    case EOpImageSampleFootprintGradNV:         out.debug << "imageSampleFootprintGradNV";      break;
    case EOpImageSampleFootprintGradClampNV:    out.debug << "mageSampleFootprintGradClampNV";  break;
    case EOpAddCarry:                   out.debug << "addCarry";              break;
    case EOpSubBorrow:                  out.debug << "subBorrow";             break;
    case EOpUMulExtended:               out.debug << "uMulExtended";          break;
    case EOpIMulExtended:               out.debug << "iMulExtended";          break;
    case EOpBitfieldExtract:            out.debug << "bitfieldExtract";       break;
    case EOpBitfieldInsert:             out.debug << "bitfieldInsert";        break;

    case EOpFma:                        out.debug << "fma";                   break;
    case EOpFrexp:                      out.debug << "frexp";                 break;
    case EOpLdexp:                      out.debug << "ldexp";                 break;

    case EOpInterpolateAtSample:   out.debug << "interpolateAtSample";    break;
    case EOpInterpolateAtOffset:   out.debug << "interpolateAtOffset";    break;
    case EOpInterpolateAtVertex:   out.debug << "interpolateAtVertex";    break;

    case EOpSinCos:                     out.debug << "sincos";                break;
    case EOpGenMul:                     out.debug << "mul";                   break;

    case EOpAllMemoryBarrierWithGroupSync:    out.debug << "AllMemoryBarrierWithGroupSync";    break;
    case EOpDeviceMemoryBarrier:              out.debug << "DeviceMemoryBarrier";              break;
    case EOpDeviceMemoryBarrierWithGroupSync: out.debug << "DeviceMemoryBarrierWithGroupSync"; break;
    case EOpWorkgroupMemoryBarrier:           out.debug << "WorkgroupMemoryBarrier";           break;
    case EOpWorkgroupMemoryBarrierWithGroupSync: out.debug << "WorkgroupMemoryBarrierWithGroupSync"; break;

    case EOpSubgroupBarrier:                 out.debug << "subgroupBarrier"; break;
    case EOpSubgroupMemoryBarrier:           out.debug << "subgroupMemoryBarrier"; break;
    case EOpSubgroupMemoryBarrierBuffer:     out.debug << "subgroupMemoryBarrierBuffer"; break;
    case EOpSubgroupMemoryBarrierImage:      out.debug << "subgroupMemoryBarrierImage";   break;
    case EOpSubgroupMemoryBarrierShared:     out.debug << "subgroupMemoryBarrierShared"; break;
    case EOpSubgroupElect:                   out.debug << "subgroupElect"; break;
    case EOpSubgroupAll:                     out.debug << "subgroupAll"; break;
    case EOpSubgroupAny:                     out.debug << "subgroupAny"; break;
    case EOpSubgroupAllEqual:                out.debug << "subgroupAllEqual"; break;
    case EOpSubgroupBroadcast:               out.debug << "subgroupBroadcast"; break;
    case EOpSubgroupBroadcastFirst:          out.debug << "subgroupBroadcastFirst"; break;
    case EOpSubgroupBallot:                  out.debug << "subgroupBallot"; break;
    case EOpSubgroupInverseBallot:           out.debug << "subgroupInverseBallot"; break;
    case EOpSubgroupBallotBitExtract:        out.debug << "subgroupBallotBitExtract"; break;
    case EOpSubgroupBallotBitCount:          out.debug << "subgroupBallotBitCount"; break;
    case EOpSubgroupBallotInclusiveBitCount: out.debug << "subgroupBallotInclusiveBitCount"; break;
    case EOpSubgroupBallotExclusiveBitCount: out.debug << "subgroupBallotExclusiveBitCount"; break;
    case EOpSubgroupBallotFindLSB:           out.debug << "subgroupBallotFindLSB"; break;
    case EOpSubgroupBallotFindMSB:           out.debug << "subgroupBallotFindMSB"; break;
    case EOpSubgroupShuffle:                 out.debug << "subgroupShuffle"; break;
    case EOpSubgroupShuffleXor:              out.debug << "subgroupShuffleXor"; break;
    case EOpSubgroupShuffleUp:               out.debug << "subgroupShuffleUp"; break;
    case EOpSubgroupShuffleDown:             out.debug << "subgroupShuffleDown"; break;
    case EOpSubgroupRotate:                  out.debug << "subgroupRotate"; break;
    case EOpSubgroupClusteredRotate:         out.debug << "subgroupClusteredRotate"; break;
    case EOpSubgroupAdd:                     out.debug << "subgroupAdd"; break;
    case EOpSubgroupMul:                     out.debug << "subgroupMul"; break;
    case EOpSubgroupMin:                     out.debug << "subgroupMin"; break;
    case EOpSubgroupMax:                     out.debug << "subgroupMax"; break;
    case EOpSubgroupAnd:                     out.debug << "subgroupAnd"; break;
    case EOpSubgroupOr:                      out.debug << "subgroupOr"; break;
    case EOpSubgroupXor:                     out.debug << "subgroupXor"; break;
    case EOpSubgroupInclusiveAdd:            out.debug << "subgroupInclusiveAdd"; break;
    case EOpSubgroupInclusiveMul:            out.debug << "subgroupInclusiveMul"; break;
    case EOpSubgroupInclusiveMin:            out.debug << "subgroupInclusiveMin"; break;
    case EOpSubgroupInclusiveMax:            out.debug << "subgroupInclusiveMax"; break;
    case EOpSubgroupInclusiveAnd:            out.debug << "subgroupInclusiveAnd"; break;
    case EOpSubgroupInclusiveOr:             out.debug << "subgroupInclusiveOr"; break;
    case EOpSubgroupInclusiveXor:            out.debug << "subgroupInclusiveXor"; break;
    case EOpSubgroupExclusiveAdd:            out.debug << "subgroupExclusiveAdd"; break;
    case EOpSubgroupExclusiveMul:            out.debug << "subgroupExclusiveMul"; break;
    case EOpSubgroupExclusiveMin:            out.debug << "subgroupExclusiveMin"; break;
    case EOpSubgroupExclusiveMax:            out.debug << "subgroupExclusiveMax"; break;
    case EOpSubgroupExclusiveAnd:            out.debug << "subgroupExclusiveAnd"; break;
    case EOpSubgroupExclusiveOr:             out.debug << "subgroupExclusiveOr"; break;
    case EOpSubgroupExclusiveXor:            out.debug << "subgroupExclusiveXor"; break;
    case EOpSubgroupClusteredAdd:            out.debug << "subgroupClusteredAdd"; break;
    case EOpSubgroupClusteredMul:            out.debug << "subgroupClusteredMul"; break;
    case EOpSubgroupClusteredMin:            out.debug << "subgroupClusteredMin"; break;
    case EOpSubgroupClusteredMax:            out.debug << "subgroupClusteredMax"; break;
    case EOpSubgroupClusteredAnd:            out.debug << "subgroupClusteredAnd"; break;
    case EOpSubgroupClusteredOr:             out.debug << "subgroupClusteredOr"; break;
    case EOpSubgroupClusteredXor:            out.debug << "subgroupClusteredXor"; break;
    case EOpSubgroupQuadBroadcast:           out.debug << "subgroupQuadBroadcast"; break;
    case EOpSubgroupQuadSwapHorizontal:      out.debug << "subgroupQuadSwapHorizontal"; break;
    case EOpSubgroupQuadSwapVertical:        out.debug << "subgroupQuadSwapVertical"; break;
    case EOpSubgroupQuadSwapDiagonal:        out.debug << "subgroupQuadSwapDiagonal"; break;
    case EOpSubgroupQuadAll:                 out.debug << "subgroupQuadAll"; break;
    case EOpSubgroupQuadAny:                 out.debug << "subgroupQuadAny"; break;

    case EOpSubgroupPartition:                          out.debug << "subgroupPartitionNV";                          break;
    case EOpSubgroupPartitionedAdd:                     out.debug << "subgroupPartitionedAddNV";                     break;
    case EOpSubgroupPartitionedMul:                     out.debug << "subgroupPartitionedMulNV";                     break;
    case EOpSubgroupPartitionedMin:                     out.debug << "subgroupPartitionedMinNV";                     break;
    case EOpSubgroupPartitionedMax:                     out.debug << "subgroupPartitionedMaxNV";                     break;
    case EOpSubgroupPartitionedAnd:                     out.debug << "subgroupPartitionedAndNV";                     break;
    case EOpSubgroupPartitionedOr:                      out.debug << "subgroupPartitionedOrNV";                      break;
    case EOpSubgroupPartitionedXor:                     out.debug << "subgroupPartitionedXorNV";                     break;
    case EOpSubgroupPartitionedInclusiveAdd:            out.debug << "subgroupPartitionedInclusiveAddNV";            break;
    case EOpSubgroupPartitionedInclusiveMul:            out.debug << "subgroupPartitionedInclusiveMulNV";            break;
    case EOpSubgroupPartitionedInclusiveMin:            out.debug << "subgroupPartitionedInclusiveMinNV";            break;
    case EOpSubgroupPartitionedInclusiveMax:            out.debug << "subgroupPartitionedInclusiveMaxNV";            break;
    case EOpSubgroupPartitionedInclusiveAnd:            out.debug << "subgroupPartitionedInclusiveAndNV";            break;
    case EOpSubgroupPartitionedInclusiveOr:             out.debug << "subgroupPartitionedInclusiveOrNV";             break;
    case EOpSubgroupPartitionedInclusiveXor:            out.debug << "subgroupPartitionedInclusiveXorNV";            break;
    case EOpSubgroupPartitionedExclusiveAdd:            out.debug << "subgroupPartitionedExclusiveAddNV";            break;
    case EOpSubgroupPartitionedExclusiveMul:            out.debug << "subgroupPartitionedExclusiveMulNV";            break;
    case EOpSubgroupPartitionedExclusiveMin:            out.debug << "subgroupPartitionedExclusiveMinNV";            break;
    case EOpSubgroupPartitionedExclusiveMax:            out.debug << "subgroupPartitionedExclusiveMaxNV";            break;
    case EOpSubgroupPartitionedExclusiveAnd:            out.debug << "subgroupPartitionedExclusiveAndNV";            break;
    case EOpSubgroupPartitionedExclusiveOr:             out.debug << "subgroupPartitionedExclusiveOrNV";             break;
    case EOpSubgroupPartitionedExclusiveXor:            out.debug << "subgroupPartitionedExclusiveXorNV";            break;

    case EOpSubpassLoad:   out.debug << "subpassLoad";   break;
    case EOpSubpassLoadMS: out.debug << "subpassLoadMS"; break;

    case EOpColorAttachmentReadEXT:   out.debug << "colorAttachmentReadEXT";   break;

    case EOpTraceNV:                          out.debug << "traceNV"; break;
    case EOpTraceRayMotionNV:                 out.debug << "traceRayMotionNV"; break;
    case EOpTraceKHR:                         out.debug << "traceRayKHR"; break;
    case EOpReportIntersection:               out.debug << "reportIntersectionNV"; break;
    case EOpIgnoreIntersectionNV:             out.debug << "ignoreIntersectionNV"; break;
    case EOpIgnoreIntersectionKHR:            out.debug << "ignoreIntersectionKHR"; break;
    case EOpTerminateRayNV:                   out.debug << "terminateRayNV"; break;
    case EOpTerminateRayKHR:                  out.debug << "terminateRayKHR"; break;
    case EOpExecuteCallableNV:                out.debug << "executeCallableNV"; break;
    case EOpExecuteCallableKHR:               out.debug << "executeCallableKHR"; break;
    case EOpWritePackedPrimitiveIndices4x8NV: out.debug << "writePackedPrimitiveIndices4x8NV"; break;
    case EOpEmitMeshTasksEXT:                 out.debug << "EmitMeshTasksEXT"; break;
    case EOpSetMeshOutputsEXT:                out.debug << "SetMeshOutputsEXT"; break;

    case EOpRayQueryInitialize:                                            out.debug << "rayQueryInitializeEXT"; break;
    case EOpRayQueryTerminate:                                             out.debug << "rayQueryTerminateEXT"; break;
    case EOpRayQueryGenerateIntersection:                                  out.debug << "rayQueryGenerateIntersectionEXT"; break;
    case EOpRayQueryConfirmIntersection:                                   out.debug << "rayQueryConfirmIntersectionEXT"; break;
    case EOpRayQueryProceed:                                               out.debug << "rayQueryProceedEXT"; break;
    case EOpRayQueryGetIntersectionType:                                   out.debug << "rayQueryGetIntersectionTypeEXT"; break;
    case EOpRayQueryGetRayTMin:                                            out.debug << "rayQueryGetRayTMinEXT"; break;
    case EOpRayQueryGetRayFlags:                                           out.debug << "rayQueryGetRayFlagsEXT"; break;
    case EOpRayQueryGetIntersectionT:                                      out.debug << "rayQueryGetIntersectionTEXT"; break;
    case EOpRayQueryGetIntersectionInstanceCustomIndex:                    out.debug << "rayQueryGetIntersectionInstanceCustomIndexEXT"; break;
    case EOpRayQueryGetIntersectionInstanceId:                             out.debug << "rayQueryGetIntersectionInstanceIdEXT"; break;
    case EOpRayQueryGetIntersectionInstanceShaderBindingTableRecordOffset: out.debug << "rayQueryGetIntersectionInstanceShaderBindingTableRecordOffsetEXT"; break;
    case EOpRayQueryGetIntersectionGeometryIndex:                          out.debug << "rayQueryGetIntersectionGeometryIndexEXT"; break;
    case EOpRayQueryGetIntersectionPrimitiveIndex:                         out.debug << "rayQueryGetIntersectionPrimitiveIndexEXT"; break;
    case EOpRayQueryGetIntersectionBarycentrics:                           out.debug << "rayQueryGetIntersectionBarycentricsEXT"; break;
    case EOpRayQueryGetIntersectionFrontFace:                              out.debug << "rayQueryGetIntersectionFrontFaceEXT"; break;
    case EOpRayQueryGetIntersectionCandidateAABBOpaque:                    out.debug << "rayQueryGetIntersectionCandidateAABBOpaqueEXT"; break;
    case EOpRayQueryGetIntersectionObjectRayDirection:                     out.debug << "rayQueryGetIntersectionObjectRayDirectionEXT"; break;
    case EOpRayQueryGetIntersectionObjectRayOrigin:                        out.debug << "rayQueryGetIntersectionObjectRayOriginEXT"; break;
    case EOpRayQueryGetWorldRayDirection:                                  out.debug << "rayQueryGetWorldRayDirectionEXT"; break;
    case EOpRayQueryGetWorldRayOrigin:                                     out.debug << "rayQueryGetWorldRayOriginEXT"; break;
    case EOpRayQueryGetIntersectionObjectToWorld:                          out.debug << "rayQueryGetIntersectionObjectToWorldEXT"; break;
    case EOpRayQueryGetIntersectionWorldToObject:                          out.debug << "rayQueryGetIntersectionWorldToObjectEXT"; break;
    case EOpRayQueryGetIntersectionTriangleVertexPositionsEXT:             out.debug << "rayQueryGetIntersectionTriangleVertexPositionsEXT"; break;
    case EOpRayQueryGetIntersectionClusterIdNV:                            out.debug << "rayQueryGetIntersectionClusterIdNV"; break;
    case EOpRayQueryGetIntersectionSpherePositionNV:                       out.debug << "rayQueryGetIntersectionSpherePositionNV"; break;
    case EOpRayQueryGetIntersectionSphereRadiusNV:                         out.debug << "rayQueryGetIntersectionSphereRadiusNV"; break;
    case EOpRayQueryGetIntersectionLSSHitValueNV:                          out.debug << "rayQueryGetIntersectionLSSHitValueNV"; break;
    case EOpRayQueryGetIntersectionLSSPositionsNV:                         out.debug << "rayQueryGetIntersectionLSSPositionsNV"; break;
    case EOpRayQueryGetIntersectionLSSRadiiNV:                             out.debug << "rayQueryGetIntersectionLSSRadiiNV"; break;
    case EOpRayQueryIsSphereHitNV:                                         out.debug << "rayQueryIsSphereHitNV"; break;
    case EOpRayQueryIsLSSHitNV:                                            out.debug << "rayQueryIsLSSHitNV"; break;

    case EOpCooperativeMatrixLoad:  out.debug << "Load cooperative matrix KHR"; break;
    case EOpCooperativeMatrixStore:  out.debug << "Store cooperative matrix KHR"; break;
    case EOpCooperativeMatrixMulAdd: out.debug << "MulAdd cooperative matrices KHR"; break;
    case EOpCooperativeMatrixLoadNV:  out.debug << "Load cooperative matrix NV"; break;
    case EOpCooperativeMatrixStoreNV:  out.debug << "Store cooperative matrix NV"; break;
    case EOpCooperativeMatrixLoadTensorNV:  out.debug << "Load cooperative matrix tensor NV"; break;
    case EOpCooperativeMatrixStoreTensorNV:  out.debug << "Store cooperative matrix tensor NV"; break;
    case EOpCooperativeMatrixMulAddNV: out.debug << "MulAdd cooperative matrices NV"; break;
    case EOpCooperativeMatrixReduceNV: out.debug << "Reduce cooperative matrices"; break;
    case EOpCooperativeMatrixPerElementOpNV: out.debug << "cooperative matrix per element op"; break;
    case EOpCooperativeMatrixTransposeNV: out.debug << "Transpose cooperative matrix"; break;

    case EOpCooperativeVectorMatMulNV: out.debug << "Cooperative vector matrix multiply NV"; break;
    case EOpCooperativeVectorMatMulAddNV: out.debug << "Cooperative vector matrix multiply add NV"; break;
    case EOpCooperativeVectorLoadNV:  out.debug << "Load cooperative vector NV"; break;
    case EOpCooperativeVectorStoreNV:  out.debug << "Store cooperative vector NV"; break;
    case EOpCooperativeVectorOuterProductAccumulateNV: out.debug << "Cooperative vector outer product accumulate NV"; break;
    case EOpCooperativeVectorReduceSumAccumulateNV: out.debug << "Cooperative vector reduce sum accumulate NV"; break;

    case EOpIsHelperInvocation: out.debug << "IsHelperInvocation"; break;
    case EOpDebugPrintf:  out.debug << "Debug printf";  break;

    case EOpHitObjectTraceRayNV: out.debug << "HitObjectTraceRayNV"; break;
    case EOpHitObjectTraceRayMotionNV: out.debug << "HitObjectTraceRayMotionNV"; break;
    case EOpHitObjectRecordHitNV: out.debug << "HitObjectRecordHitNV"; break;
    case EOpHitObjectRecordHitMotionNV: out.debug << "HitObjectRecordHitMotionNV"; break;
    case EOpHitObjectRecordHitWithIndexNV: out.debug << "HitObjectRecordHitWithIndexNV"; break;
    case EOpHitObjectRecordHitWithIndexMotionNV: out.debug << "HitObjectRecordHitWithIndexMotionNV"; break;
    case EOpHitObjectRecordMissNV: out.debug << "HitObjectRecordMissNV"; break;
    case EOpHitObjectRecordMissMotionNV: out.debug << "HitObjectRecordMissMotionNV"; break;
    case EOpHitObjectRecordEmptyNV: out.debug << "HitObjectRecordEmptyNV"; break;
    case EOpHitObjectExecuteShaderNV: out.debug << "HitObjectExecuteShaderNV"; break;
    case EOpHitObjectIsEmptyNV: out.debug << "HitObjectIsEmptyNV"; break;
    case EOpHitObjectIsMissNV: out.debug << "HitObjectIsMissNV"; break;
    case EOpHitObjectIsHitNV:  out.debug << "HitObjectIsHitNV"; break;
    case EOpHitObjectGetRayTMinNV: out.debug << "HitObjectGetRayTMinNV"; break;
    case EOpHitObjectGetRayTMaxNV: out.debug << "HitObjectGetRayTMaxNV"; break;
    case EOpHitObjectGetObjectRayOriginNV: out.debug << "HitObjectGetObjectRayOriginNV"; break;
    case EOpHitObjectGetObjectRayDirectionNV: out.debug << "HitObjectGetObjectRayDirectionNV"; break;
    case EOpHitObjectGetWorldRayOriginNV: out.debug << "HitObjectGetWorldRayOriginNV"; break;
    case EOpHitObjectGetWorldRayDirectionNV: out.debug << "HitObjectGetWorldRayDirectionNV"; break;
    case EOpHitObjectGetObjectToWorldNV: out.debug << "HitObjectGetObjectToWorldNV"; break;
    case EOpHitObjectGetWorldToObjectNV: out.debug << "HitObjectGetWorldToObjectNV"; break;
    case EOpHitObjectGetInstanceCustomIndexNV: out.debug<< "HitObjectGetInstanceCustomIndexNV"; break;
    case EOpHitObjectGetInstanceIdNV: out.debug << "HitObjectGetInstaneIdNV"; break;
    case EOpHitObjectGetGeometryIndexNV: out.debug << "HitObjectGetGeometryIndexNV"; break;
    case EOpHitObjectGetPrimitiveIndexNV: out.debug << "HitObjectGetPrimitiveIndexNV"; break;
    case EOpHitObjectGetHitKindNV: out.debug << "HitObjectGetHitKindNV"; break;
    case EOpHitObjectGetAttributesNV: out.debug << "HitObjectGetAttributesNV"; break;
    case EOpHitObjectGetCurrentTimeNV: out.debug << "HitObjectGetCurrentTimeNV"; break;
    case EOpHitObjectGetShaderBindingTableRecordIndexNV: out.debug << "HitObjectGetShaderBindingTableRecordIndexNV"; break;
    case EOpHitObjectGetShaderRecordBufferHandleNV: out.debug << "HitObjectReadShaderRecordBufferHandleNV"; break;
    case EOpHitObjectGetClusterIdNV: out.debug << "HitObjectGetClusterIdNV"; break;
    case EOpReorderThreadNV: out.debug << "ReorderThreadNV"; break;
    case EOpFetchMicroTriangleVertexPositionNV: out.debug << "MicroTriangleVertexPositionNV"; break;
    case EOpFetchMicroTriangleVertexBarycentricNV: out.debug << "MicroTriangleVertexBarycentricNV"; break;
    case EOpHitObjectGetSpherePositionNV: out.debug << "HitObjectGetSpherePositionNV"; break;
    case EOpHitObjectGetSphereRadiusNV:   out.debug << "HitObjectGetSphereRadiusNV"; break;
    case EOpHitObjectGetLSSPositionsNV:   out.debug << "HitObjectGetLSSPositionsNV"; break;
    case EOpHitObjectGetLSSRadiiNV:       out.debug << "HitObjectGetLSSRadiiNV"; break;
    case EOpHitObjectIsSphereHitNV:       out.debug << "HitObjectIsSphereHitNV"; break;
    case EOpHitObjectIsLSSHitNV:          out.debug << "HitObjectIsLSSHitNV"; break;

    case EOpSpirvInst: out.debug << "spirv_instruction"; break;
    case EOpStencilAttachmentReadEXT: out.debug << "stencilAttachmentReadEXT"; break;
    case EOpDepthAttachmentReadEXT: out.debug << "depthAttachmentReadEXT"; break;

    case EOpCreateTensorLayoutNV:           out.debug << "createTensorLayout"; break;
    case EOpTensorLayoutSetBlockSizeNV:     out.debug << "setBlockSize"; break;
    case EOpTensorLayoutSetDimensionNV:     out.debug << "setDimension"; break;
    case EOpTensorLayoutSetStrideNV:        out.debug << "setStride"; break;
    case EOpTensorLayoutSliceNV:            out.debug << "slice"; break;
    case EOpTensorLayoutSetClampValueNV:    out.debug << "setClampValue"; break;
    case EOpCreateTensorViewNV:             out.debug << "createTensorView"; break;
    case EOpTensorViewSetDimensionNV:       out.debug << "setTensorViewDimensions"; break;
    case EOpTensorViewSetStrideNV:          out.debug << "setTensorViewStride"; break;
    case EOpTensorViewSetClipNV:            out.debug << "clipTensorView"; break;

    default: out.debug.message(EPrefixError, "Bad aggregation op");
    }

    if (node->getOp() != EOpSequence && node->getOp() != EOpScope && node->getOp() != EOpParameters)
        out.debug << " (" << node->getCompleteString() << ")";

    out.debug << "\n";

    return true;
}